

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall
amrex::Amr::InitializeInit
          (Amr *this,Real strt_time,Real param_3,BoxArray *lev0_grids,
          Vector<int,_std::allocator<int>_> *pmap)

{
  ulong uVar1;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  int linit;
  Amr *in_stack_000001b0;
  Vector<int,_std::allocator<int>_> *in_stack_000001f8;
  BoxArray *in_stack_00000200;
  Real in_stack_00000208;
  Amr *in_stack_00000210;
  int *in_stack_000005c8;
  Amr *in_stack_000005d0;
  
  if ((*(byte *)(in_RDI + 0x90) & 1) != 0) {
    checkInput(in_stack_000001b0);
  }
  *(undefined4 *)(in_RDI + 0x94) = 0;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    readProbinFile(in_stack_000005d0,in_stack_000005c8);
  }
  *(undefined8 *)(in_RDI + 0x140) = in_XMM0_Qa;
  defBaseLevel(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  return;
}

Assistant:

void
Amr::InitializeInit(Real              strt_time,
                    Real              /*stop_time*/,
                    const BoxArray*   lev0_grids,
                    const Vector<int>* pmap)
{
    BL_PROFILE("Amr::InitializeInit()");
    BL_COMM_PROFILE_NAMETAG("Amr::InitializeInit TOP");
    if (check_input) checkInput();
    //
    // Generate internal values from user-supplied values.
    //
    finest_level = 0;
    //
    // Init problem dependent data.
    //

#ifndef AMREX_NO_PROBINIT
    if (!probin_file.empty()) {
        int linit = true;
        readProbinFile(linit);
    }
#endif

    cumtime = strt_time;
    //
    // Define base level grids.  Note that if we are restarting from a plotfile, this
    //    routine will call the level 0 AmrLevel initialization which will overwrite cumtime.
    //
    defBaseLevel(strt_time, lev0_grids, pmap);
}